

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
slang::SmallVector<slang::SmallVector<int,_10UL>,_2UL>::SmallVector
          (SmallVector<slang::SmallVector<int,_10UL>,_2UL> *this,Base *other)

{
  bool bVar1;
  move_iterator<slang::SmallVector<int,_10UL>_*> last;
  move_iterator<slang::SmallVector<int,_10UL>_*> this_00;
  SmallVector<int,_10UL> *pSVar2;
  unsigned_long uVar3;
  move_iterator<slang::SmallVector<int,_10UL>_*> in_RSI;
  SmallVectorBase<slang::SmallVector<int,_10UL>_> *in_RDI;
  SmallVector<int,_10UL> *in_stack_ffffffffffffff98;
  SmallVectorBase<slang::SmallVector<int,_10UL>_> *in_stack_ffffffffffffffa0;
  
  SmallVectorBase<slang::SmallVector<int,_10UL>_>::SmallVectorBase(in_RDI);
  bVar1 = SmallVectorBase<slang::SmallVector<int,_10UL>_>::isSmall
                    ((SmallVectorBase<slang::SmallVector<int,_10UL>_> *)in_RSI._M_current);
  if (bVar1) {
    in_RDI->cap = 2;
    SmallVectorBase<slang::SmallVector<int,_10UL>_>::begin
              ((SmallVectorBase<slang::SmallVector<int,_10UL>_> *)in_RSI._M_current);
    last = std::make_move_iterator<slang::SmallVector<int,10ul>*>(in_stack_ffffffffffffff98);
    SmallVectorBase<slang::SmallVector<int,_10UL>_>::end
              ((SmallVectorBase<slang::SmallVector<int,_10UL>_> *)in_RSI._M_current);
    this_00 = std::make_move_iterator<slang::SmallVector<int,10ul>*>(in_stack_ffffffffffffff98);
    SmallVectorBase<slang::SmallVector<int,_10UL>_>::
    append<std::move_iterator<slang::SmallVector<int,_10UL>_*>_>
              ((SmallVectorBase<slang::SmallVector<int,_10UL>_> *)this_00._M_current,in_RSI,last);
    SmallVectorBase<slang::SmallVector<int,_10UL>_>::clear(in_stack_ffffffffffffffa0);
  }
  else {
    pSVar2 = std::exchange<slang::SmallVector<int,10ul>*,decltype(nullptr)>
                       (&in_stack_ffffffffffffffa0->data_,(void **)in_stack_ffffffffffffff98);
    in_RDI->data_ = pSVar2;
    uVar3 = std::exchange<unsigned_long,int>
                      ((unsigned_long *)in_stack_ffffffffffffffa0,(int *)in_stack_ffffffffffffff98);
    in_RDI->len = uVar3;
    uVar3 = std::exchange<unsigned_long,int>
                      ((unsigned_long *)in_stack_ffffffffffffffa0,(int *)in_stack_ffffffffffffff98);
    in_RDI->cap = uVar3;
  }
  return;
}

Assistant:

SmallVector(Base&& other) noexcept {
        if (other.isSmall()) {
            this->cap = N;
            this->append(std::make_move_iterator(other.begin()),
                         std::make_move_iterator(other.end()));
            other.clear();
        }
        else {
            this->data_ = std::exchange(other.data_, nullptr);
            this->len = std::exchange(other.len, 0);
            this->cap = std::exchange(other.cap, 0);
        }
    }